

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_fontdef_jp.c
# Opt level: O1

HPDF_STATUS MS_PGothic_Init(HPDF_FontDef fontdef)

{
  HPDF_STATUS HVar1;
  HPDF_Box HVar2;
  
  fontdef->ascent = 0x35b;
  fontdef->descent = -0x8c;
  fontdef->cap_height = 0x2a7;
  HVar2 = HPDF_ToBox(-0x79,-0x88,0x3e4,0x35b);
  fontdef->font_bbox = HVar2;
  fontdef->flags = 4;
  fontdef->italic_angle = 0;
  fontdef->stemv = 0x4e;
  HVar1 = HPDF_CIDFontDef_AddWidth(fontdef,MS_PGothic_W_ARRAY);
  if (HVar1 == 0) {
    fontdef->type = HPDF_FONTDEF_TYPE_CID;
    fontdef->valid = 1;
    HVar1 = 0;
  }
  return HVar1;
}

Assistant:

static HPDF_STATUS
MS_PGothic_Init  (HPDF_FontDef   fontdef)
{
    HPDF_STATUS ret;

    HPDF_PTRACE ((" HPDF_FontDef_MS_PGothic_Init\n"));

    fontdef->ascent = 859;
    fontdef->descent = -140;
    fontdef->cap_height = 679;
    fontdef->font_bbox = HPDF_ToBox(-121, -136, 996, 859);
    fontdef->flags = HPDF_FONT_SYMBOLIC;
    fontdef->italic_angle = 0;
    fontdef->stemv = 78;
    if ((ret = HPDF_CIDFontDef_AddWidth (fontdef, MS_PGothic_W_ARRAY)) !=
                HPDF_OK) {
        return ret;
    }

    fontdef->type = HPDF_FONTDEF_TYPE_CID;
    fontdef->valid = HPDF_TRUE;

    return HPDF_OK;
}